

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_text_undo(ImGuiInputTextState *str,STB_TexteditState *state)

{
  undefined4 pos;
  undefined4 n;
  undefined4 new_text_len;
  undefined4 uVar1;
  ImWchar IVar2;
  StbUndoState *state_00;
  StbUndoRecord *pSVar3;
  int iVar4;
  int local_3c;
  int i;
  StbUndoRecord *r;
  StbUndoRecord u;
  StbUndoState *s;
  STB_TexteditState *state_local;
  ImGuiInputTextState *str_local;
  
  state_00 = &state->undostate;
  if ((state->undostate).undo_point != 0) {
    pSVar3 = state_00->undo_rec + ((state->undostate).undo_point + -1);
    pos = pSVar3->where;
    new_text_len = pSVar3->insert_length;
    n = pSVar3->delete_length;
    uVar1 = pSVar3->char_storage;
    pSVar3 = state_00->undo_rec + ((state->undostate).redo_point + -1);
    pSVar3->char_storage = -1;
    pSVar3->insert_length = n;
    pSVar3->delete_length = new_text_len;
    pSVar3->where = pos;
    if (n != 0) {
      if ((state->undostate).undo_char_point + n < 999) {
        while ((state->undostate).redo_char_point < (state->undostate).undo_char_point + n) {
          if ((state->undostate).redo_point == 99) {
            return;
          }
          stb_textedit_discard_redo(state_00);
        }
        iVar4 = (state->undostate).redo_point + -1;
        state_00->undo_rec[iVar4].char_storage = (state->undostate).redo_char_point - n;
        (state->undostate).redo_char_point = (state->undostate).redo_char_point - n;
        for (local_3c = 0; local_3c < (int)n; local_3c = local_3c + 1) {
          IVar2 = STB_TEXTEDIT_GETCHAR(str,pos + local_3c);
          (state->undostate).undo_char[state_00->undo_rec[iVar4].char_storage + local_3c] = IVar2;
        }
      }
      else {
        pSVar3->insert_length = 0;
      }
      STB_TEXTEDIT_DELETECHARS(str,pos,n);
    }
    if (new_text_len != 0) {
      STB_TEXTEDIT_INSERTCHARS(str,pos,(state->undostate).undo_char + (int)uVar1,new_text_len);
      (state->undostate).undo_char_point = (state->undostate).undo_char_point - new_text_len;
    }
    state->cursor = pos + new_text_len;
    (state->undostate).undo_point = (state->undostate).undo_point + -1;
    (state->undostate).redo_point = (state->undostate).redo_point + -1;
  }
  return;
}

Assistant:

static void stb_text_undo(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   StbUndoState *s = &state->undostate;
   StbUndoRecord u, *r;
   if (s->undo_point == 0)
      return;

   // we need to do two things: apply the undo record, and create a redo record
   u = s->undo_rec[s->undo_point-1];
   r = &s->undo_rec[s->redo_point-1];
   r->char_storage = -1;

   r->insert_length = u.delete_length;
   r->delete_length = u.insert_length;
   r->where = u.where;

   if (u.delete_length) {
      // if the undo record says to delete characters, then the redo record will
      // need to re-insert the characters that get deleted, so we need to store
      // them.

      // there are three cases:
      //    there's enough room to store the characters
      //    characters stored for *redoing* don't leave room for redo
      //    characters stored for *undoing* don't leave room for redo
      // if the last is true, we have to bail

      if (s->undo_char_point + u.delete_length >= STB_TEXTEDIT_UNDOCHARCOUNT) {
         // the undo records take up too much character space; there's no space to store the redo characters
         r->insert_length = 0;
      } else {
         int i;

         // there's definitely room to store the characters eventually
         while (s->undo_char_point + u.delete_length > s->redo_char_point) {
            // should never happen:
            if (s->redo_point == STB_TEXTEDIT_UNDOSTATECOUNT)
               return;
            // there's currently not enough room, so discard a redo record
            stb_textedit_discard_redo(s);
         }
         r = &s->undo_rec[s->redo_point-1];

         r->char_storage = s->redo_char_point - u.delete_length;
         s->redo_char_point = s->redo_char_point - u.delete_length;

         // now save the characters
         for (i=0; i < u.delete_length; ++i)
            s->undo_char[r->char_storage + i] = STB_TEXTEDIT_GETCHAR(str, u.where + i);
      }

      // now we can carry out the deletion
      STB_TEXTEDIT_DELETECHARS(str, u.where, u.delete_length);
   }

   // check type of recorded action:
   if (u.insert_length) {
      // easy case: was a deletion, so we need to insert n characters
      STB_TEXTEDIT_INSERTCHARS(str, u.where, &s->undo_char[u.char_storage], u.insert_length);
      s->undo_char_point -= u.insert_length;
   }

   state->cursor = u.where + u.insert_length;

   s->undo_point--;
   s->redo_point--;
}